

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

Status __thiscall leveldb::VersionEdit::DecodeFrom(VersionEdit *this,Slice *src)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>,_bool> pVar3;
  char *msg;
  Status *result;
  Slice str;
  uint64_t number;
  int level;
  uint32_t tag;
  Slice input;
  InternalKey key;
  FileMetaData f;
  VersionEdit *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  Slice *in_stack_fffffffffffffdc8;
  _Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> in_stack_fffffffffffffdd8;
  Slice *in_stack_fffffffffffffde0;
  Slice *in_stack_fffffffffffffdf8;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *local_1c0;
  undefined4 local_14c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  Clear(in_stack_fffffffffffffdb8);
  local_1c0 = (char *)0x0;
  FileMetaData::FileMetaData((FileMetaData *)in_stack_fffffffffffffdd8._M_node);
  Slice::Slice((Slice *)in_stack_fffffffffffffdb8);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  while( true ) {
    uVar4 = false;
    if (local_1c0 == (char *)0x0) {
      in_stack_fffffffffffffe16 =
           GetVarint32(in_stack_fffffffffffffde0,&(in_stack_fffffffffffffdd8._M_node)->_M_color);
      uVar4 = in_stack_fffffffffffffe16;
    }
    if ((bool)uVar4 == false) break;
    switch(local_14c) {
    case 1:
      bVar2 = GetLengthPrefixedSlice
                        (in_stack_fffffffffffffdc8,
                         (Slice *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
      if (bVar2) {
        Slice::ToString_abi_cxx11_(in_stack_fffffffffffffdf8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe16,
                                                   in_stack_fffffffffffffe10)));
        std::__cxx11::string::~string(&in_stack_fffffffffffffdb8->comparator_);
        *(undefined1 *)(in_RSI + 0x40) = 1;
      }
      else {
        local_1c0 = "comparator name";
      }
      break;
    case 2:
      bVar2 = GetVarint64(in_stack_fffffffffffffde0,(uint64_t *)in_stack_fffffffffffffdd8._M_node);
      if (bVar2) {
        *(undefined1 *)(in_RSI + 0x41) = 1;
      }
      else {
        local_1c0 = "log number";
      }
      break;
    case 3:
      bVar2 = GetVarint64(in_stack_fffffffffffffde0,(uint64_t *)in_stack_fffffffffffffdd8._M_node);
      if (bVar2) {
        *(undefined1 *)(in_RSI + 0x43) = 1;
      }
      else {
        local_1c0 = "next file number";
      }
      break;
    case 4:
      bVar2 = GetVarint64(in_stack_fffffffffffffde0,(uint64_t *)in_stack_fffffffffffffdd8._M_node);
      if (bVar2) {
        *(undefined1 *)(in_RSI + 0x44) = 1;
      }
      else {
        local_1c0 = "last sequence number";
      }
      break;
    case 5:
      bVar2 = GetLevel((Slice *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       (int *)in_stack_fffffffffffffdb8);
      if ((bVar2) &&
         (bVar2 = GetInternalKey((Slice *)CONCAT17(in_stack_fffffffffffffdc7,
                                                   in_stack_fffffffffffffdc0),
                                 (InternalKey *)in_stack_fffffffffffffdb8), bVar2)) {
        in_stack_fffffffffffffdf8 = (Slice *)(in_RSI + 0x48);
        std::make_pair<int&,leveldb::InternalKey&>
                  ((int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   (InternalKey *)in_stack_fffffffffffffdb8);
        std::
        vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ::push_back((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                     *)in_stack_fffffffffffffdb8,(value_type *)0xd2d83f);
        std::pair<int,_leveldb::InternalKey>::~pair
                  ((pair<int,_leveldb::InternalKey> *)in_stack_fffffffffffffdb8);
      }
      else {
        local_1c0 = "compaction pointer";
      }
      break;
    case 6:
      bVar2 = GetLevel((Slice *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       (int *)in_stack_fffffffffffffdb8);
      if ((bVar2) &&
         (bVar2 = GetVarint64(in_stack_fffffffffffffde0,
                              (uint64_t *)in_stack_fffffffffffffdd8._M_node), bVar2)) {
        in_stack_fffffffffffffde0 = (Slice *)(in_RSI + 0x60);
        std::make_pair<int&,unsigned_long&>
                  ((int *)in_stack_fffffffffffffdc8,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
        pVar3 = std::
                set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                ::insert((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
                          *)in_stack_fffffffffffffdc8,
                         (value_type *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                        );
        in_stack_fffffffffffffdd8 = pVar3.first._M_node;
      }
      else {
        local_1c0 = "deleted file";
      }
      break;
    case 7:
      bVar2 = GetLevel((Slice *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       (int *)in_stack_fffffffffffffdb8);
      if ((((bVar2) &&
           (bVar2 = GetVarint64(in_stack_fffffffffffffde0,
                                (uint64_t *)in_stack_fffffffffffffdd8._M_node), bVar2)) &&
          (bVar2 = GetVarint64(in_stack_fffffffffffffde0,
                               (uint64_t *)in_stack_fffffffffffffdd8._M_node), bVar2)) &&
         ((bVar2 = GetInternalKey((Slice *)CONCAT17(in_stack_fffffffffffffdc7,
                                                    in_stack_fffffffffffffdc0),
                                  (InternalKey *)in_stack_fffffffffffffdb8), bVar2 &&
          (bVar2 = GetInternalKey((Slice *)CONCAT17(in_stack_fffffffffffffdc7,
                                                    in_stack_fffffffffffffdc0),
                                  (InternalKey *)in_stack_fffffffffffffdb8), bVar2)))) {
        in_stack_fffffffffffffdc8 = (Slice *)(in_RSI + 0x90);
        std::make_pair<int&,leveldb::FileMetaData&>
                  ((int *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   (FileMetaData *)in_stack_fffffffffffffdb8);
        std::
        vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
        ::push_back((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)in_stack_fffffffffffffdb8,(value_type *)0xd2da6f);
        std::pair<int,_leveldb::FileMetaData>::~pair
                  ((pair<int,_leveldb::FileMetaData> *)in_stack_fffffffffffffdb8);
      }
      else {
        local_1c0 = "new-file entry";
      }
      break;
    default:
      local_1c0 = "unknown tag";
      break;
    case 9:
      bVar2 = GetVarint64(in_stack_fffffffffffffde0,(uint64_t *)in_stack_fffffffffffffdd8._M_node);
      if (bVar2) {
        *(undefined1 *)(in_RSI + 0x42) = 1;
      }
      else {
        local_1c0 = "previous log number";
      }
    }
  }
  if ((local_1c0 == (char *)0x0) &&
     (in_stack_fffffffffffffdc7 = Slice::empty((Slice *)in_stack_fffffffffffffdb8),
     !(bool)in_stack_fffffffffffffdc7)) {
    local_1c0 = "invalid tag";
  }
  Status::Status((Status *)in_stack_fffffffffffffdb8);
  if (local_1c0 != (char *)0x0) {
    Slice::Slice(in_stack_fffffffffffffdc8,
                 (char *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    Slice::Slice(in_stack_fffffffffffffdc8,
                 (char *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    Status::Corruption((Slice *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                       (Slice *)in_stack_fffffffffffffdb8);
    Status::operator=((Status *)in_stack_fffffffffffffdc8,
                      (Status *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    Status::~Status((Status *)in_stack_fffffffffffffdb8);
  }
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  FileMetaData::~FileMetaData((FileMetaData *)in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status VersionEdit::DecodeFrom(const Slice& src) {
  Clear();
  Slice input = src;
  const char* msg = nullptr;
  uint32_t tag;

  // Temporary storage for parsing
  int level;
  uint64_t number;
  FileMetaData f;
  Slice str;
  InternalKey key;

  while (msg == nullptr && GetVarint32(&input, &tag)) {
    switch (tag) {
      case kComparator:
        if (GetLengthPrefixedSlice(&input, &str)) {
          comparator_ = str.ToString();
          has_comparator_ = true;
        } else {
          msg = "comparator name";
        }
        break;

      case kLogNumber:
        if (GetVarint64(&input, &log_number_)) {
          has_log_number_ = true;
        } else {
          msg = "log number";
        }
        break;

      case kPrevLogNumber:
        if (GetVarint64(&input, &prev_log_number_)) {
          has_prev_log_number_ = true;
        } else {
          msg = "previous log number";
        }
        break;

      case kNextFileNumber:
        if (GetVarint64(&input, &next_file_number_)) {
          has_next_file_number_ = true;
        } else {
          msg = "next file number";
        }
        break;

      case kLastSequence:
        if (GetVarint64(&input, &last_sequence_)) {
          has_last_sequence_ = true;
        } else {
          msg = "last sequence number";
        }
        break;

      case kCompactPointer:
        if (GetLevel(&input, &level) && GetInternalKey(&input, &key)) {
          compact_pointers_.push_back(std::make_pair(level, key));
        } else {
          msg = "compaction pointer";
        }
        break;

      case kDeletedFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &number)) {
          deleted_files_.insert(std::make_pair(level, number));
        } else {
          msg = "deleted file";
        }
        break;

      case kNewFile:
        if (GetLevel(&input, &level) && GetVarint64(&input, &f.number) &&
            GetVarint64(&input, &f.file_size) &&
            GetInternalKey(&input, &f.smallest) &&
            GetInternalKey(&input, &f.largest)) {
          new_files_.push_back(std::make_pair(level, f));
        } else {
          msg = "new-file entry";
        }
        break;

      default:
        msg = "unknown tag";
        break;
    }
  }

  if (msg == nullptr && !input.empty()) {
    msg = "invalid tag";
  }

  Status result;
  if (msg != nullptr) {
    result = Status::Corruption("VersionEdit", msg);
  }
  return result;
}